

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O2

int Gia_ManAppendMuxReal(Gia_Man_t *p,int iLitC,int iLit1,int iLit0)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Gia_Obj_t *pObj;
  ulong uVar6;
  
  pObj = Gia_ManAppendObj(p);
  if (p->pMuxes == (uint *)0x0) {
    __assert_fail("p->pMuxes != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x2c5,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
  }
  iVar2 = Abc_Lit2Var(iLit0);
  if (p->nObjs <= iVar2) {
    __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x2c6,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
  }
  iVar2 = Abc_Lit2Var(iLit1);
  if (p->nObjs <= iVar2) {
    __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x2c7,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
  }
  iVar2 = Abc_Lit2Var(iLitC);
  if (iVar2 < p->nObjs) {
    iVar2 = Abc_Lit2Var(iLit0);
    iVar3 = Abc_Lit2Var(iLit1);
    if (iVar2 == iVar3) {
      __assert_fail("Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                    ,0x2c9,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
    }
    iVar2 = Abc_Lit2Var(iLitC);
    iVar3 = Abc_Lit2Var(iLit0);
    if (iVar2 != iVar3) {
      iVar2 = Abc_Lit2Var(iLitC);
      iVar3 = Abc_Lit2Var(iLit1);
      if (iVar2 == iVar3) {
        __assert_fail("Abc_Lit2Var(iLitC) != Abc_Lit2Var(iLit1)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x2cb,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
      }
      if (p->pHTable != (int *)0x0) {
        iVar2 = Abc_LitIsCompl(iLit1);
        if (iVar2 != 0) {
          __assert_fail("!p->pHTable || !Abc_LitIsCompl(iLit1)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                        ,0x2cc,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
        }
      }
      uVar4 = Abc_Lit2Var(iLit0);
      uVar5 = Abc_Lit2Var(iLit1);
      iVar2 = Gia_ObjId(p,pObj);
      iVar3 = Abc_Lit2Var(iLit0);
      uVar6 = (ulong)(iVar2 - iVar3 & 0x1fffffff);
      if (uVar4 < uVar5) {
        *(ulong *)pObj = *(ulong *)pObj & 0xffffffffe0000000 | uVar6;
        iVar2 = Abc_LitIsCompl(iLit0);
        *(ulong *)pObj = *(ulong *)pObj & 0xffffffffdfffffff | (ulong)(uint)(iVar2 << 0x1d);
        iVar2 = Gia_ObjId(p,pObj);
        iVar3 = Abc_Lit2Var(iLit1);
        *(ulong *)pObj =
             *(ulong *)pObj & 0xe0000000ffffffff | (ulong)(iVar2 - iVar3 & 0x1fffffff) << 0x20;
        uVar4 = Abc_LitIsCompl(iLit1);
        *(ulong *)pObj = *(ulong *)pObj & 0xdfffffffffffffff | (ulong)uVar4 << 0x3d;
      }
      else {
        *(ulong *)pObj = *(ulong *)pObj & 0xe0000000ffffffff | uVar6 << 0x20;
        uVar4 = Abc_LitIsCompl(iLit0);
        *(ulong *)pObj = *(ulong *)pObj & 0xdfffffffffffffff | (ulong)uVar4 << 0x3d;
        iVar2 = Gia_ObjId(p,pObj);
        iVar3 = Abc_Lit2Var(iLit1);
        *(ulong *)pObj = *(ulong *)pObj & 0xffffffffe0000000 | (ulong)(iVar2 - iVar3 & 0x1fffffff);
        iVar2 = Abc_LitIsCompl(iLit1);
        *(ulong *)pObj = *(ulong *)pObj & 0xffffffffdfffffff | (ulong)(uint)(iVar2 << 0x1d);
        iLitC = Abc_LitNot(iLitC);
      }
      puVar1 = p->pMuxes;
      iVar2 = Gia_ObjId(p,pObj);
      puVar1[iVar2] = iLitC;
      p->nMuxes = p->nMuxes + 1;
      iVar2 = Gia_ObjId(p,pObj);
      return iVar2 * 2;
    }
    __assert_fail("Abc_Lit2Var(iLitC) != Abc_Lit2Var(iLit0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x2ca,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
  }
  __assert_fail("iLitC >= 0 && Abc_Lit2Var(iLitC) < Gia_ManObjNum(p)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                ,0x2c8,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
}

Assistant:

static inline int Gia_ManAppendMuxReal( Gia_Man_t * p, int iLitC, int iLit1, int iLit0 )  
{ 
    Gia_Obj_t * pObj = Gia_ManAppendObj( p );
    assert( p->pMuxes != NULL );
    assert( iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p) );
    assert( iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p) );
    assert( iLitC >= 0 && Abc_Lit2Var(iLitC) < Gia_ManObjNum(p) );
    assert( Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1) );
    assert( Abc_Lit2Var(iLitC) != Abc_Lit2Var(iLit0) );
    assert( Abc_Lit2Var(iLitC) != Abc_Lit2Var(iLit1) );
    assert( !p->pHTable || !Abc_LitIsCompl(iLit1) );
    if ( Abc_Lit2Var(iLit0) < Abc_Lit2Var(iLit1) )
    {
        pObj->iDiff0  = Gia_ObjId(p, pObj) - Abc_Lit2Var(iLit0);
        pObj->fCompl0 = Abc_LitIsCompl(iLit0);
        pObj->iDiff1  = Gia_ObjId(p, pObj) - Abc_Lit2Var(iLit1);
        pObj->fCompl1 = Abc_LitIsCompl(iLit1);
        p->pMuxes[Gia_ObjId(p, pObj)] = iLitC;
    }
    else
    {
        pObj->iDiff1  = Gia_ObjId(p, pObj) - Abc_Lit2Var(iLit0);
        pObj->fCompl1 = Abc_LitIsCompl(iLit0);
        pObj->iDiff0  = Gia_ObjId(p, pObj) - Abc_Lit2Var(iLit1);
        pObj->fCompl0 = Abc_LitIsCompl(iLit1);
        p->pMuxes[Gia_ObjId(p, pObj)] = Abc_LitNot(iLitC);
    }
    p->nMuxes++;
    return Gia_ObjId( p, pObj ) << 1;
}